

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5PorterGobbleVC(char *zStem,int nStem,int bPrevCons)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  
  if (nStem < 1) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      bVar5 = zStem[uVar3] + 0x9f;
      bVar5 = bVar5 >> 1 | bVar5 * -0x80;
      if ((10 < bVar5) || (uVar7 = 1, (0x495U >> (bVar5 & 0x1f) & 1) == 0)) {
        uVar7 = (uint)(zStem[uVar3] == 'y' && bPrevCons != 0);
      }
      bPrevCons = uVar7 ^ 1;
      uVar4 = uVar3;
    } while ((uVar7 == 0) && (uVar3 = uVar3 + 1, uVar4 = (ulong)(uint)nStem, (uint)nStem != uVar3));
  }
  if ((int)uVar4 + 1 < nStem) {
    pcVar6 = zStem + (uVar4 & 0xffffffff);
    iVar2 = (int)uVar4 + 2;
    do {
      pcVar6 = pcVar6 + 1;
      bVar5 = *pcVar6 + 0x9f;
      bVar5 = bVar5 >> 1 | bVar5 * -0x80;
      if ((10 < bVar5) || (uVar7 = 1, (0x495U >> (bVar5 & 0x1f) & 1) == 0)) {
        uVar7 = (uint)(*pcVar6 == 'y' && bPrevCons != 0);
      }
      if (uVar7 == 0) {
        return iVar2;
      }
      bPrevCons = uVar7 ^ 1;
      bVar1 = iVar2 < nStem;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

static int fts5PorterGobbleVC(char *zStem, int nStem, int bPrevCons){
  int i;
  int bCons = bPrevCons;

  /* Scan for a vowel */
  for(i=0; i<nStem; i++){
    if( 0==(bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) break;
  }

  /* Scan for a consonent */
  for(i++; i<nStem; i++){
    if( (bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) return i+1;
  }
  return 0;
}